

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O1

rt_return_value_t rt_free_context(rt_context_pointer *context)

{
  int *piVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  piVar1 = (int *)*context;
  if (0 < *piVar1) {
    lVar4 = 8;
    lVar3 = 0;
    do {
      if (*(int *)(*(long *)(piVar1 + 2) + -8 + lVar4) == 0) {
        (*rt_variable_free_func)(*(void **)(*(long *)(piVar1 + 2) + lVar4));
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < *piVar1);
  }
  (*rt_free_func)(*(void **)(piVar1 + 2));
  (*rt_free_func)(*(void **)(piVar1 + 6));
  if (0 < piVar1[8]) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      (*rt_free_func)(*(void **)(*(long *)(piVar1 + 10) + 0x10 + lVar4));
      (*rt_free_func)(*(void **)(*(long *)(piVar1 + 10) + 0x20 + lVar4));
      (**(code **)(*(long *)(piVar1 + 10) + lVar4 + 0x30))();
      pvVar2 = *(void **)(*(long *)(piVar1 + 10) + 0x38 + lVar4);
      if (pvVar2 != (void *)0x0) {
        (*rt_free_func)(pvVar2);
        *(undefined8 *)(*(long *)(piVar1 + 10) + 0x38 + lVar4) = 0;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x40;
    } while (lVar3 < piVar1[8]);
  }
  (*rt_free_func)(*(void **)(piVar1 + 10));
  (*rt_free_func)(*(void **)(piVar1 + 0xe));
  (*rt_free_func)(*(void **)(piVar1 + 0x12));
  if (*(void **)(piVar1 + 0x16) != (void *)0x0) {
    (*rt_free_func)(*(void **)(piVar1 + 0x16));
  }
  (*rt_free_func)(*context);
  return RT_RET_NOERROR;
}

Assistant:

rt_return_value_t rt_free_context(rt_context_pointer *context) {
  rt_context_t *c = *context;

  int i; // Iterator

  // Buffers
  for (i = 0; i < c->num_of_buffers; i++) {
    if (c->buffers[i].allocate_type == RT_BUFFER_ALLOCATE_TYPE_MALLOC) {
      rt_variable_free_func(c->buffers[i].buffer);
    }
  }
  rt_free_func(c->buffers);

  // Variables
  rt_free_func(c->variables);

  // Functions
  for (i = 0; i < c->num_of_functions; i++) {
    rt_free_func(c->functions[i].func.inputs);
    rt_free_func(c->functions[i].func.outputs);

    c->functions[i].func.free_local_context_func(&(c->functions[i].func));
    if (c->functions[i].func.local_context != 0) {
      rt_free_func(c->functions[i].func.local_context);
      c->functions[i].func.local_context = NULL;
    }
  }
  rt_free_func(c->functions);

  rt_free_func(c->input_variable_ids);
  rt_free_func(c->output_variable_ids);

  // Callback
  if (c->callbacks) {
    rt_free_func(c->callbacks);
  }

  rt_free_func(*context);
  return RT_RET_NOERROR;
}